

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall wasm::TranslateToFuzzReader::makeSIMDShuffle(TranslateToFuzzReader *this)

{
  uint32_t uVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  size_t i;
  long lVar5;
  undefined8 uStack_40;
  array<unsigned_char,_16UL> mask;
  
  pEVar2 = make(this,(Type)0x6);
  pEVar3 = make(this,(Type)0x6);
  lVar5 = 0;
  do {
    uVar1 = Random::upTo(&this->random,0x20);
    mask._M_elems[lVar5 + -8] = (uchar)uVar1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10);
  pEVar4 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x30,8);
  *(undefined8 *)pEVar4 = 0;
  (pEVar4->type).id = 0;
  pEVar4->_id = SIMDShuffleId;
  *(Expression **)(pEVar4 + 1) = pEVar2;
  pEVar4[1].type.id = (uintptr_t)pEVar3;
  *(undefined8 *)(pEVar4 + 2) = uStack_40;
  pEVar4[2].type.id = mask._M_elems._0_8_;
  wasm::SIMDShuffle::finalize();
  return pEVar4;
}

Assistant:

Expression* TranslateToFuzzReader::makeSIMDShuffle() {
  Expression* left = make(Type::v128);
  Expression* right = make(Type::v128);
  std::array<uint8_t, 16> mask;
  for (size_t i = 0; i < 16; ++i) {
    mask[i] = upTo(32);
  }
  return builder.makeSIMDShuffle(left, right, mask);
}